

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntlm.c
# Opt level: O2

CURLcode Curl_auth_create_ntlm_type3_message
                   (Curl_easy *data,char *userp,char *passwdp,ntlmdata *ntlm,bufref *out)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  Curl_easy *data_00;
  ntlmdata *pnVar4;
  CURLcode CVar5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong domlen;
  uint uVar11;
  size_t sVar12;
  uint uVar13;
  char *__s;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  uint ntresplen;
  uint local_90c;
  long local_908;
  size_t local_900;
  char *local_8f8;
  Curl_easy *local_8f0;
  uchar *ntlmv2resp;
  uint local_8e0;
  uint local_8dc;
  uint local_8d8;
  uint local_8d4;
  uchar *local_8d0;
  ntlmdata *local_8c8;
  uchar entropy [8];
  uchar lmresp [24];
  uchar lmbuffer [24];
  uchar ntresp [24];
  uchar ntlmbuf [1024];
  char host [1025];
  
  ntresplen = 0x18;
  ntlmv2resp = (uchar *)0x0;
  local_90c = ntlm->flags;
  local_8f0 = data;
  memset(host,0,0x401);
  lmresp[0] = '\0';
  lmresp[1] = '\0';
  lmresp[2] = '\0';
  lmresp[3] = '\0';
  lmresp[4] = '\0';
  lmresp[5] = '\0';
  lmresp[6] = '\0';
  lmresp[7] = '\0';
  lmresp[8] = '\0';
  lmresp[9] = '\0';
  lmresp[10] = '\0';
  lmresp[0xb] = '\0';
  lmresp[0xc] = '\0';
  lmresp[0xd] = '\0';
  lmresp[0xe] = '\0';
  lmresp[0xf] = '\0';
  lmresp[0x10] = '\0';
  lmresp[0x11] = '\0';
  lmresp[0x12] = '\0';
  lmresp[0x13] = '\0';
  lmresp[0x14] = '\0';
  lmresp[0x15] = '\0';
  lmresp[0x16] = '\0';
  lmresp[0x17] = '\0';
  ntresp[0] = '\0';
  ntresp[1] = '\0';
  ntresp[2] = '\0';
  ntresp[3] = '\0';
  ntresp[4] = '\0';
  ntresp[5] = '\0';
  ntresp[6] = '\0';
  ntresp[7] = '\0';
  ntresp[8] = '\0';
  ntresp[9] = '\0';
  ntresp[10] = '\0';
  ntresp[0xb] = '\0';
  ntresp[0xc] = '\0';
  ntresp[0xd] = '\0';
  ntresp[0xe] = '\0';
  ntresp[0xf] = '\0';
  ntresp[0x10] = '\0';
  ntresp[0x11] = '\0';
  ntresp[0x12] = '\0';
  ntresp[0x13] = '\0';
  ntresp[0x14] = '\0';
  ntresp[0x15] = '\0';
  ntresp[0x16] = '\0';
  ntresp[0x17] = '\0';
  pcVar6 = strchr(userp,0x5c);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = strchr(userp,0x2f);
  }
  domlen = (long)pcVar6 - (long)userp;
  __s = pcVar6 + 1;
  if (pcVar6 == (char *)0x0) {
    __s = userp;
  }
  local_8f8 = userp;
  if (pcVar6 == (char *)0x0) {
    domlen = 0;
    local_8f8 = "";
  }
  local_900 = strlen(__s);
  curl_msnprintf(host,0x401,"%s","WORKSTATION");
  if ((ntlm->flags & 0x80000) == 0) {
    CVar5 = Curl_ntlm_core_mk_nt_hash(passwdp,ntlmbuf);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    Curl_ntlm_core_lm_resp(ntlmbuf,ntlm->nonce,ntresp);
    CVar5 = Curl_ntlm_core_mk_lm_hash(passwdp,lmbuffer);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    local_8d0 = ntresp;
    Curl_ntlm_core_lm_resp(lmbuffer,ntlm->nonce,lmresp);
    uVar16 = ntlm->flags & 0xfff7ffff;
    ntlm->flags = uVar16;
    uVar14 = 0x18;
  }
  else {
    CVar5 = Curl_rand(local_8f0,entropy,8);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    CVar5 = Curl_ntlm_core_mk_nt_hash(passwdp,ntlmbuf);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    CVar5 = Curl_ntlm_core_mk_ntlmv2_hash(__s,local_900,local_8f8,domlen,ntlmbuf,lmbuffer);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    CVar5 = Curl_ntlm_core_mk_lmv2_resp(lmbuffer,entropy,ntlm->nonce,lmresp);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    CVar5 = Curl_ntlm_core_mk_ntlmv2_resp(lmbuffer,entropy,ntlm,&ntlmv2resp,&ntresplen);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    local_8d0 = ntlmv2resp;
    uVar16 = ntlm->flags;
    uVar14 = ntresplen;
  }
  bVar17 = (local_90c & 1) == 0;
  local_908 = 0x16;
  if (bVar17) {
    local_908 = 0xb;
  }
  sVar3 = local_900 * 2;
  sVar12 = sVar3;
  if (bVar17) {
    sVar12 = local_900;
  }
  uVar10 = domlen * 2;
  if (bVar17) {
    uVar10 = domlen;
  }
  uVar2 = (uint)uVar10;
  uVar8 = uVar2 + uVar14 + 0x58;
  uVar15 = uVar14 >> 8 & 0xff;
  uVar9 = uVar2 >> 8 & 0xff;
  local_8e0 = uVar14 + 0x58 & 0xff;
  local_8dc = (uint)sVar12 & 0xff;
  uVar13 = (uint)(sVar12 >> 8) & 0xff;
  local_8d4 = uVar8 & 0xff;
  uVar11 = (uint)sVar12 + uVar8;
  local_8d8 = uVar11 & 0xff;
  local_8c8 = ntlm;
  uVar16 = curl_msnprintf((char *)ntlmbuf,0x400,
                          "NTLMSSP%c\x03%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c"
                          ,0,0,0,0,0x18,0,0x18,0,0x40,0,0,0,uVar14 & 0xff,uVar15,uVar14 & 0xff,
                          uVar15,0x58,0,0,0,uVar2 & 0xff,uVar9,uVar2 & 0xff,uVar9,local_8e0,
                          uVar14 + 0x58 >> 8 & 0xff,0,0,local_8dc,uVar13,local_8dc,uVar13,local_8d4,
                          uVar8 >> 8 & 0xff,0,0,(int)local_908,0,(int)local_908,0,local_8d8,
                          uVar11 >> 8 & 0xff,0,0,0,0,0,0,0,0,0,0,uVar16 & 0xff,uVar16 >> 8 & 0xff,
                          uVar16 >> 0x10 & 0xff,uVar16 >> 0x18);
  pnVar4 = local_8c8;
  data_00 = local_8f0;
  lVar7 = (long)(int)uVar16;
  if (uVar16 < 1000) {
    *(undefined8 *)(ntlmbuf + lVar7 + 0x10) = lmresp._16_8_;
    *(undefined8 *)(ntlmbuf + lVar7) = lmresp._0_8_;
    *(undefined8 *)(ntlmbuf + lVar7 + 8) = lmresp._8_8_;
    lVar7 = lVar7 + 0x18;
  }
  uVar1 = lVar7 + (ulong)ntresplen;
  if (uVar1 < 0x401) {
    memcpy(ntlmbuf + lVar7,local_8d0,(ulong)ntresplen);
    (*Curl_cfree)(ntlmv2resp);
    if (uVar10 + uVar1 + sVar12 + local_908 < 0x400) {
      if ((local_90c & 1) == 0) {
        memcpy(ntlmbuf + uVar1,local_8f8,domlen);
        sVar3 = local_900;
        memcpy(ntlmbuf + uVar1 + domlen,__s,local_900);
        lVar7 = uVar1 + domlen + sVar3;
        *(ulong *)(ntlmbuf + lVar7) = CONCAT17(host[7],host._0_7_);
        *(undefined4 *)(ntlmbuf + lVar7 + 7) = host._7_4_;
      }
      else {
        unicodecpy(ntlmbuf + uVar1,local_8f8,domlen & 0x7fffffffffffffff);
        lVar7 = uVar1 + domlen * 2;
        unicodecpy(ntlmbuf + lVar7,__s,local_900 & 0x7fffffffffffffff);
        lVar7 = lVar7 + sVar3;
        unicodecpy(ntlmbuf + lVar7,host,0xb);
      }
      CVar5 = Curl_bufref_memdup(out,ntlmbuf,lVar7 + local_908);
      (*Curl_cfree)(pnVar4->target_info);
      pnVar4->target_info = (void *)0x0;
      pnVar4->target_info_len = 0;
      return CVar5;
    }
    pcVar6 = "user + domain + host name too big";
  }
  else {
    pcVar6 = "incoming NTLM message too big";
  }
  Curl_failf(data_00,pcVar6);
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_auth_create_ntlm_type3_message(struct Curl_easy *data,
                                             const char *userp,
                                             const char *passwdp,
                                             struct ntlmdata *ntlm,
                                             struct bufref *out)
{
  /* NTLM type-3 message structure:

          Index  Description            Content
            0    NTLMSSP Signature      Null-terminated ASCII "NTLMSSP"
                                        (0x4e544c4d53535000)
            8    NTLM Message Type      long (0x03000000)
           12    LM/LMv2 Response       security buffer
           20    NTLM/NTLMv2 Response   security buffer
           28    Target Name            security buffer
           36    User Name              security buffer
           44    Workstation Name       security buffer
          (52)   Session Key            security buffer (*)
          (60)   Flags                  long (*)
          (64)   OS Version Structure   8 bytes (*)
  52 (64) (72)   Start of data block
                                          (*) -> Optional
  */

  CURLcode result = CURLE_OK;
  size_t size;
  unsigned char ntlmbuf[NTLM_BUFSIZE];
  int lmrespoff;
  unsigned char lmresp[24]; /* fixed-size */
  int ntrespoff;
  unsigned int ntresplen = 24;
  unsigned char ntresp[24]; /* fixed-size */
  unsigned char *ptr_ntresp = &ntresp[0];
  unsigned char *ntlmv2resp = NULL;
  bool unicode = (ntlm->flags & NTLMFLAG_NEGOTIATE_UNICODE) ? TRUE : FALSE;
  char host[HOSTNAME_MAX + 1] = "";
  const char *user;
  const char *domain = "";
  size_t hostoff = 0;
  size_t useroff = 0;
  size_t domoff = 0;
  size_t hostlen = 0;
  size_t userlen = 0;
  size_t domlen = 0;

  memset(lmresp, 0, sizeof(lmresp));
  memset(ntresp, 0, sizeof(ntresp));
  user = strchr(userp, '\\');
  if(!user)
    user = strchr(userp, '/');

  if(user) {
    domain = userp;
    domlen = (user - domain);
    user++;
  }
  else
    user = userp;

  userlen = strlen(user);

#ifndef NTLM_HOSTNAME
  /* Get the machine's un-qualified host name as NTLM doesn't like the fully
     qualified domain name */
  if(Curl_gethostname(host, sizeof(host))) {
    infof(data, "gethostname() failed, continuing without");
    hostlen = 0;
  }
  else {
    hostlen = strlen(host);
  }
#else
  (void)msnprintf(host, sizeof(host), "%s", NTLM_HOSTNAME);
  hostlen = sizeof(NTLM_HOSTNAME)-1;
#endif

  if(ntlm->flags & NTLMFLAG_NEGOTIATE_NTLM2_KEY) {
    unsigned char ntbuffer[0x18];
    unsigned char entropy[8];
    unsigned char ntlmv2hash[0x18];

    /* Full NTLM version 2
       Although this cannot be negotiated, it is used here if available, as
       servers featuring extended security are likely supporting also
       NTLMv2. */
    result = Curl_rand(data, entropy, 8);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_nt_hash(passwdp, ntbuffer);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_ntlmv2_hash(user, userlen, domain, domlen,
                                           ntbuffer, ntlmv2hash);
    if(result)
      return result;

    /* LMv2 response */
    result = Curl_ntlm_core_mk_lmv2_resp(ntlmv2hash, entropy,
                                         &ntlm->nonce[0], lmresp);
    if(result)
      return result;

    /* NTLMv2 response */
    result = Curl_ntlm_core_mk_ntlmv2_resp(ntlmv2hash, entropy,
                                           ntlm, &ntlmv2resp, &ntresplen);
    if(result)
      return result;

    ptr_ntresp = ntlmv2resp;
  }
  else {

    unsigned char ntbuffer[0x18];
    unsigned char lmbuffer[0x18];

    /* NTLM version 1 */

    result = Curl_ntlm_core_mk_nt_hash(passwdp, ntbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], ntresp);

    result = Curl_ntlm_core_mk_lm_hash(passwdp, lmbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(lmbuffer, &ntlm->nonce[0], lmresp);
    ntlm->flags &= ~NTLMFLAG_NEGOTIATE_NTLM2_KEY;

    /* A safer but less compatible alternative is:
     *   Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], lmresp);
     * See https://davenport.sourceforge.net/ntlm.html#ntlmVersion2 */
  }

  if(unicode) {
    domlen = domlen * 2;
    userlen = userlen * 2;
    hostlen = hostlen * 2;
  }

  lmrespoff = 64; /* size of the message header */
  ntrespoff = lmrespoff + 0x18;
  domoff = ntrespoff + ntresplen;
  useroff = domoff + domlen;
  hostoff = useroff + userlen;

  /* Create the big type-3 message binary blob */
  size = msnprintf((char *)ntlmbuf, NTLM_BUFSIZE,
                   NTLMSSP_SIGNATURE "%c"
                   "\x03%c%c%c"  /* 32-bit type = 3 */

                   "%c%c"  /* LanManager length */
                   "%c%c"  /* LanManager allocated space */
                   "%c%c"  /* LanManager offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* NT-response length */
                   "%c%c"  /* NT-response allocated space */
                   "%c%c"  /* NT-response offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* domain length */
                   "%c%c"  /* domain allocated space */
                   "%c%c"  /* domain name offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* user length */
                   "%c%c"  /* user allocated space */
                   "%c%c"  /* user offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* host length */
                   "%c%c"  /* host allocated space */
                   "%c%c"  /* host offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* session key length (unknown purpose) */
                   "%c%c"  /* session key allocated space (unknown purpose) */
                   "%c%c"  /* session key offset (unknown purpose) */
                   "%c%c"  /* 2 zeroes */

                   "%c%c%c%c",  /* flags */

                   /* domain string */
                   /* user string */
                   /* host string */
                   /* LanManager response */
                   /* NT response */

                   0,                /* null-termination */
                   0, 0, 0,          /* type-3 long, the 24 upper bits */

                   SHORTPAIR(0x18),  /* LanManager response length, twice */
                   SHORTPAIR(0x18),
                   SHORTPAIR(lmrespoff),
                   0x0, 0x0,

                   SHORTPAIR(ntresplen),  /* NT-response length, twice */
                   SHORTPAIR(ntresplen),
                   SHORTPAIR(ntrespoff),
                   0x0, 0x0,

                   SHORTPAIR(domlen),
                   SHORTPAIR(domlen),
                   SHORTPAIR(domoff),
                   0x0, 0x0,

                   SHORTPAIR(userlen),
                   SHORTPAIR(userlen),
                   SHORTPAIR(useroff),
                   0x0, 0x0,

                   SHORTPAIR(hostlen),
                   SHORTPAIR(hostlen),
                   SHORTPAIR(hostoff),
                   0x0, 0x0,

                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,

                   LONGQUARTET(ntlm->flags));

  DEBUGASSERT(size == 64);
  DEBUGASSERT(size == (size_t)lmrespoff);

  /* We append the binary hashes */
  if(size < (NTLM_BUFSIZE - 0x18)) {
    memcpy(&ntlmbuf[size], lmresp, 0x18);
    size += 0x18;
  }

  DEBUG_OUT({
    fprintf(stderr, "**** TYPE3 header lmresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[lmrespoff], 0x18);
  });

  /* ntresplen + size should not be risking an integer overflow here */
  if(ntresplen + size > sizeof(ntlmbuf)) {
    failf(data, "incoming NTLM message too big");
    return CURLE_OUT_OF_MEMORY;
  }
  DEBUGASSERT(size == (size_t)ntrespoff);
  memcpy(&ntlmbuf[size], ptr_ntresp, ntresplen);
  size += ntresplen;

  DEBUG_OUT({
    fprintf(stderr, "\n   ntresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[ntrespoff], ntresplen);
  });

  free(ntlmv2resp);/* Free the dynamic buffer allocated for NTLMv2 */

  DEBUG_OUT({
    fprintf(stderr, "\n   flags=0x%02.2x%02.2x%02.2x%02.2x 0x%08.8x ",
            LONGQUARTET(ntlm->flags), ntlm->flags);
    ntlm_print_flags(stderr, ntlm->flags);
    fprintf(stderr, "\n****\n");
  });

  /* Make sure that the domain, user and host strings fit in the
     buffer before we copy them there. */
  if(size + userlen + domlen + hostlen >= NTLM_BUFSIZE) {
    failf(data, "user + domain + host name too big");
    return CURLE_OUT_OF_MEMORY;
  }

  DEBUGASSERT(size == domoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], domain, domlen / 2);
  else
    memcpy(&ntlmbuf[size], domain, domlen);

  size += domlen;

  DEBUGASSERT(size == useroff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], user, userlen / 2);
  else
    memcpy(&ntlmbuf[size], user, userlen);

  size += userlen;

  DEBUGASSERT(size == hostoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], host, hostlen / 2);
  else
    memcpy(&ntlmbuf[size], host, hostlen);

  size += hostlen;

  /* Return the binary blob. */
  result = Curl_bufref_memdup(out, ntlmbuf, size);

  Curl_auth_cleanup_ntlm(ntlm);

  return result;
}